

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O2

int GetBits(uint8_t *data,size_t data_size,size_t nb,int *val,uint64_t *bit_pos)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 0;
  while( true ) {
    *val = iVar2;
    bVar3 = nb == 0;
    nb = nb - 1;
    if (bVar3) {
      return 1;
    }
    uVar1 = *bit_pos;
    *bit_pos = uVar1 + 1;
    if (data_size <= uVar1 >> 3) break;
    iVar2 = (uint)((byte)(data[uVar1 >> 3] << ((byte)uVar1 & 7)) >> 7) + iVar2 * 2;
  }
  return 0;
}

Assistant:

static int GetBits(const uint8_t* const data, size_t data_size, size_t nb,
                   int* val, uint64_t* const bit_pos) {
  *val = 0;
  while (nb-- > 0) {
    const uint64_t p = (*bit_pos)++;
    if ((p >> 3) >= data_size) {
      return 0;
    } else {
      const int bit = !!(data[p >> 3] & (128 >> ((p & 7))));
      *val = (*val << 1) | bit;
    }
  }
  return 1;
}